

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void plot_sprites(tgestate_t *state)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  long in_RDI;
  int visible;
  int found;
  itemstruct_t *itemstruct;
  vischar_t *vischar;
  tgestate_t *in_stack_00000018;
  uint8_t index;
  tgestate_t *in_stack_00000028;
  tgestate_t *in_stack_00000030;
  vischar_t *in_stack_000000e8;
  tgestate_t *in_stack_000000f0;
  tgestate_t *in_stack_ffffffffffffffe0;
  vischar_t *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  byte in_stack_fffffffffffffff7;
  
  while (iVar2 = get_next_drawable(in_stack_00000018,&vischar->character,(vischar_t **)itemstruct,
                                   (itemstruct_t **)_visible), iVar2 != 0) {
    if ((in_stack_fffffffffffffff7 & 0x40) == 0) {
      iVar3 = setup_vischar_plotting(in_stack_00000028,(vischar_t *)state);
      if (iVar3 != 0) {
        render_mask_buffer(in_stack_00000030);
        if (*(char *)(in_RDI + 0x693) != -1) {
          searchlight_mask_test
                    ((tgestate_t *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
                     in_stack_ffffffffffffffe8);
        }
        if (in_stack_ffffffffffffffe8->width_bytes == '\x03') {
          plot_masked_sprite_16px(in_stack_ffffffffffffffe0,(vischar_t *)CONCAT44(iVar2,iVar3));
        }
        else {
          plot_masked_sprite_24px(in_stack_000000f0,in_stack_000000e8);
        }
      }
    }
    else {
      uVar1 = setup_item_plotting((tgestate_t *)itemstruct,_visible,(item_t)((ulong)in_RDI >> 0x38))
      ;
      if (uVar1 != '\0') {
        render_mask_buffer(in_stack_00000030);
        plot_masked_sprite_16px_x_is_zero((tgestate_t *)0x1078d9);
      }
    }
  }
  return;
}

Assistant:

void plot_sprites(tgestate_t *state)
{
  uint8_t       index;      /* was A */
  vischar_t    *vischar;    /* was IY */
  itemstruct_t *itemstruct; /* was IY */
  int           found;      /* was Z */
  int           visible;    /* was Z */

  assert(state != NULL);

  for (;;)
  {
    /* This can return a vischar OR an itemstruct, but not both. */
    found = get_next_drawable(state, &index, &vischar, &itemstruct);
    if (!found)
      return;

#ifndef NDEBUG
    if (vischar)
      ASSERT_VISCHAR_VALID(vischar);
    else
      assert(itemstruct != NULL);
#endif

    if ((index & item_FOUND) == 0)
    {
      visible = setup_vischar_plotting(state, vischar);
      if (visible)
      {
        render_mask_buffer(state);
        if (state->searchlight_state != searchlight_STATE_SEARCHING)
          searchlight_mask_test(state, vischar);
        if (vischar->width_bytes != 3)
          plot_masked_sprite_24px(state, vischar);
        else
          plot_masked_sprite_16px(state, vischar);
      }
    }
    else
    {
      visible = setup_item_plotting(state, itemstruct, index);
      if (visible)
      {
        render_mask_buffer(state);
        plot_masked_sprite_16px_x_is_zero(state);
      }
    }
  }
}